

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O2

void __thiscall foxxll::file::~file(file *this)

{
  Logger LStack_188;
  
  this->_vptr_file = (_func_int **)&PTR___cxa_pure_virtual_00166118;
  if ((this->request_ref_).reference_count_.super___atomic_base<unsigned_long>._M_i != 0) {
    tlx::Logger::Logger(&LStack_188);
    std::operator<<((ostream *)&LStack_188,"foxxll::file is being deleted while there are still ");
    std::ostream::_M_insert<unsigned_long>((ulong)&LStack_188);
    std::operator<<((ostream *)&LStack_188," (unfinished) requests referencing it");
    tlx::Logger::~Logger(&LStack_188);
  }
  tlx::ReferenceCounter::~ReferenceCounter(&this->request_ref_);
  tlx::ReferenceCounter::~ReferenceCounter(&this->super_reference_counter);
  return;
}

Assistant:

virtual ~file()
    {
        const size_t nr = get_request_nref();
        if (nr != 0) {
            TLX_LOG1 << "foxxll::file is being deleted while there are still "
                     << nr << " (unfinished) requests referencing it";
        }
    }